

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Base::~Base(Base *this)

{
  Base *this_local;
  
  ~Base(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Base() {}